

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
               (AutoFile *is,
               map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               *m)

{
  long lVar1;
  uint64_t uVar2;
  iterator __pos;
  int iVar3;
  long in_FS_OFFSET;
  pair<uint256,_long> item;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
  ::clear(&m->_M_t);
  uVar2 = ReadCompactSize<AutoFile>(is,true);
  __pos._M_node = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (iVar3 = (int)uVar2, uVar2 = (uint64_t)(iVar3 - 1), iVar3 != 0) {
    item.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    item.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    item.second = 0;
    Unserialize<AutoFile,uint256,long>(is,&item);
    __pos = std::
            _Rb_tree<uint256,std::pair<uint256_const,long>,std::_Select1st<std::pair<uint256_const,long>>,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
            ::_M_emplace_hint_unique<std::pair<uint256,long>&>
                      ((_Rb_tree<uint256,std::pair<uint256_const,long>,std::_Select1st<std::pair<uint256_const,long>>,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
                        *)m,__pos._M_node,&item);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::map<K, T, Pred, A>& m)
{
    m.clear();
    unsigned int nSize = ReadCompactSize(is);
    typename std::map<K, T, Pred, A>::iterator mi = m.begin();
    for (unsigned int i = 0; i < nSize; i++)
    {
        std::pair<K, T> item;
        Unserialize(is, item);
        mi = m.insert(mi, item);
    }
}